

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

int Min_CoverContainsCube(Min_Man_t *p,Min_Cube_t *pCube)

{
  int iVar1;
  int local_2c;
  Min_Cube_t *pMStack_28;
  int i;
  Min_Cube_t *pThis;
  Min_Cube_t *pCube_local;
  Min_Man_t *p_local;
  
  local_2c = 0;
  do {
    if ((int)(*(uint *)&pCube->field_0x8 >> 0x16) < local_2c) {
      return 0;
    }
    for (pMStack_28 = p->ppStore[local_2c]; pMStack_28 != (Min_Cube_t *)0x0;
        pMStack_28 = pMStack_28->pNext) {
      if ((pMStack_28 != p->pBubble) && (iVar1 = Min_CubeIsContained(pMStack_28,pCube), iVar1 != 0))
      {
        return 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static inline int Min_CoverContainsCube( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis;
    int i;
/*
    // this cube cannot be equal to any cube
    Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            Min_CubeWrite( stdout, pCube );
            assert( 0 );
        }
    }
*/
    // try to find a containing cube
    for ( i = 0; i <= (int)pCube->nLits; i++ )
    Min_CoverForEachCube( p->ppStore[i], pThis )
    {
        // skip the bubble
        if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
            return 1;
    }
    return 0;
}